

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_wait_mips64(CPUMIPSState_conflict5 *env)

{
  CPUMIPSState_conflict5 *__mptr;
  
  *(undefined4 *)&env[-1].tcs[0xd].PC = 1;
  cpu_reset_interrupt((CPUState *)(env[-3].tcs[0xc].gpr + 0x12),0x100);
  do_raise_exception(env,0x10001,0);
}

Assistant:

void helper_wait(CPUMIPSState *env)
{
    CPUState *cs = env_cpu(env);

    cs->halted = 1;
    cpu_reset_interrupt(cs, CPU_INTERRUPT_WAKE);
    /*
     * Last instruction in the block, PC was updated before
     * - no need to recover PC and icount.
     */
    raise_exception(env, EXCP_HLT);
}